

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondResultTest.cpp
# Opt level: O0

void __thiscall CondResultTest::CondResultTest(CondResultTest *this)

{
  char local_f1;
  shared_ptr<oout::CondResult> local_f0;
  shared_ptr<oout::CondResult> local_e0;
  shared_ptr<CountFailureRepr> local_d0;
  shared_ptr<CountFailureRepr> local_c0;
  shared_ptr<const_oout::NamedTest> local_b0;
  char local_99;
  shared_ptr<oout::CondResult> local_98;
  shared_ptr<oout::CondResult> local_88;
  shared_ptr<CountFailureRepr> local_78;
  shared_ptr<CountFailureRepr> local_68;
  shared_ptr<const_oout::NamedTest> local_58 [2];
  allocator<char> local_31;
  string local_30;
  CondResultTest *local_10;
  CondResultTest *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"CondResult test",&local_31);
  local_99 = '\x01';
  std::make_shared<oout::CondResult,bool,char_const(&)[8]>
            ((bool *)&local_98,(char (*) [8])&local_99);
  std::make_shared<oout::CountFailure,std::shared_ptr<oout::CondResult>>(&local_88);
  std::make_shared<CountFailureRepr,std::shared_ptr<oout::CountFailure>>
            ((shared_ptr<oout::CountFailure> *)&local_78);
  std::make_shared<oout::EqualTest,std::shared_ptr<CountFailureRepr>,char_const(&)[2]>
            (&local_68,(char (*) [2])&local_78);
  std::make_shared<oout::NamedTest_const,char_const(&)[34],std::shared_ptr<oout::EqualTest>>
            ((char (*) [34])local_58,
             (shared_ptr<oout::EqualTest> *)"CondResult succes if cond is true");
  local_f1 = '\0';
  std::make_shared<oout::CondResult,bool,char_const(&)[8]>
            ((bool *)&local_f0,(char (*) [8])&local_f1);
  std::make_shared<oout::CountFailure,std::shared_ptr<oout::CondResult>>(&local_e0);
  std::make_shared<CountFailureRepr,std::shared_ptr<oout::CountFailure>>
            ((shared_ptr<oout::CountFailure> *)&local_d0);
  std::make_shared<oout::EqualTest,std::shared_ptr<CountFailureRepr>,char_const(&)[2]>
            (&local_c0,(char (*) [2])&local_d0);
  std::make_shared<oout::NamedTest_const,char_const(&)[36],std::shared_ptr<oout::EqualTest>>
            ((char (*) [36])&local_b0,
             (shared_ptr<oout::EqualTest> *)"CondResult failure if cond is false");
  oout::dirty::Test::
  Test<std::shared_ptr<oout::NamedTest_const>,std::shared_ptr<oout::NamedTest_const>>
            (&this->super_Test,&local_30,local_58,&local_b0);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(&local_b0);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_c0);
  std::shared_ptr<CountFailureRepr>::~shared_ptr(&local_d0);
  std::shared_ptr<oout::CountFailure>::~shared_ptr((shared_ptr<oout::CountFailure> *)&local_e0);
  std::shared_ptr<oout::CondResult>::~shared_ptr(&local_f0);
  std::shared_ptr<const_oout::NamedTest>::~shared_ptr(local_58);
  std::shared_ptr<oout::EqualTest>::~shared_ptr((shared_ptr<oout::EqualTest> *)&local_68);
  std::shared_ptr<CountFailureRepr>::~shared_ptr(&local_78);
  std::shared_ptr<oout::CountFailure>::~shared_ptr((shared_ptr<oout::CountFailure> *)&local_88);
  std::shared_ptr<oout::CondResult>::~shared_ptr(&local_98);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_Test).super_Test._vptr_Test = (_func_int **)&PTR__CondResultTest_003232f0;
  return;
}

Assistant:

CondResultTest::CondResultTest()
: dirty::Test(
	"CondResult test",
	make_shared<const NamedTest>(
		"CondResult succes if cond is true",
		make_shared<EqualTest>(
			make_shared<CountFailureRepr>(
				make_shared<CountFailure>(
					make_shared<CondResult>(true, "success")
				)
			),
			"0"
		)
	),
	make_shared<const NamedTest>(
		"CondResult failure if cond is false",
		make_shared<EqualTest>(
			make_shared<CountFailureRepr>(
				make_shared<CountFailure>(
					make_shared<CondResult>(false, "failure")
				)
			),
			"1"
		)
	)
)
{
}